

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

void __thiscall
httplib::detail::SocketStream::get_remote_ip_and_port(SocketStream *this,string *ip,int *port)

{
  int *port_local;
  string *ip_local;
  SocketStream *this_local;
  
  detail::get_remote_ip_and_port(this->sock_,ip,port);
  return;
}

Assistant:

inline void SocketStream::get_remote_ip_and_port(std::string& ip,
            int& port) const {
            return detail::get_remote_ip_and_port(sock_, ip, port);
        }